

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDComponentList::CreateFromVertexList
          (ON_SubDComponentList *this,ON_SubD *subd,
          ON_SimpleArray<const_ON_SubDVertex_*> *vertex_list)

{
  ON_SubDVertex *pOVar1;
  bool bVar2;
  uint uVar3;
  ON_SubDVertex **ppOVar4;
  ON_SubDVertex *v;
  uint local_78;
  uint i;
  uint marked_count;
  undefined1 local_60 [4];
  uint count;
  ON_SubDComponentMarksClearAndRestore saved_marks;
  ON_SimpleArray<const_ON_SubDVertex_*> *vertex_list_local;
  ON_SubD *subd_local;
  ON_SubDComponentList *this_local;
  
  saved_marks._56_8_ = vertex_list;
  ON_SubDComponentMarksClearAndRestore::ON_SubDComponentMarksClearAndRestore
            ((ON_SubDComponentMarksClearAndRestore *)local_60,subd);
  uVar3 = ON_SimpleArray<const_ON_SubDVertex_*>::UnsignedCount
                    ((ON_SimpleArray<const_ON_SubDVertex_*> *)saved_marks._56_8_);
  local_78 = 0;
  for (v._4_4_ = 0; v._4_4_ < uVar3; v._4_4_ = v._4_4_ + 1) {
    ppOVar4 = ON_SimpleArray<const_ON_SubDVertex_*>::operator[]
                        ((ON_SimpleArray<const_ON_SubDVertex_*> *)saved_marks._56_8_,v._4_4_);
    pOVar1 = *ppOVar4;
    if ((pOVar1 != (ON_SubDVertex *)0x0) &&
       (bVar2 = ON_ComponentStatus::RuntimeMark(&(pOVar1->super_ON_SubDComponentBase).m_status),
       !bVar2)) {
      ON_ComponentStatus::SetRuntimeMark(&(pOVar1->super_ON_SubDComponentBase).m_status);
      local_78 = local_78 + 1;
    }
  }
  uVar3 = Internal_Create(this,subd,true,false,false,true,local_78);
  ON_SubDComponentMarksClearAndRestore::~ON_SubDComponentMarksClearAndRestore
            ((ON_SubDComponentMarksClearAndRestore *)local_60);
  return uVar3;
}

Assistant:

unsigned ON_SubDComponentList::CreateFromVertexList(const ON_SubD& subd, const ON_SimpleArray<const ON_SubDVertex*>& vertex_list)
{
  ON_SubDComponentMarksClearAndRestore saved_marks(subd);
  const unsigned count = vertex_list.UnsignedCount();
  unsigned marked_count = 0;
  for (unsigned i = 0; i < count; ++i)
  {
    const ON_SubDVertex* v = vertex_list[i];
    if (nullptr == v)
      continue;
    if (v->m_status.RuntimeMark())
      continue;
    v->m_status.SetRuntimeMark();
    ++marked_count;
  }
  return Internal_Create(subd, true, false, false, true, marked_count);
}